

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_init_ex(ma_backend *backends,ma_uint32 backendCount,
                           ma_context_config *pContextConfig,ma_device_config *pConfig,
                           ma_device *pDevice)

{
  ma_result mVar1;
  undefined1 local_c0 [8];
  ma_allocation_callbacks allocationCallbacks;
  ma_backend *pmStack_98;
  ma_uint32 backendsToIterateCount;
  ma_backend *pBackendsToIterate;
  ma_backend local_88;
  ma_uint32 iBackend;
  ma_backend defaultBackends [15];
  ma_context *pContext;
  ma_result result;
  ma_device *pDevice_local;
  ma_device_config *pConfig_local;
  ma_context_config *pContextConfig_local;
  ma_uint32 backendCount_local;
  ma_backend *backends_local;
  
  if (pConfig == (ma_device_config *)0x0) {
    backends_local._4_4_ = -2;
  }
  else {
    if (pContextConfig == (ma_context_config *)0x0) {
      ma_allocation_callbacks_init_default();
    }
    else {
      mVar1 = ma_allocation_callbacks_init_copy
                        ((ma_allocation_callbacks *)local_c0,&pContextConfig->allocationCallbacks);
      if (mVar1 != 0) {
        return mVar1;
      }
    }
    register0x00000000 =
         (ma_context *)ma__malloc_from_callbacks(0x3d8,(ma_allocation_callbacks *)local_c0);
    if (register0x00000000 == (ma_context *)0x0) {
      backends_local._4_4_ = -4;
    }
    else {
      for (pBackendsToIterate._4_4_ = ma_backend_wasapi;
          pBackendsToIterate._4_4_ < (ma_backend_null|ma_backend_dsound);
          pBackendsToIterate._4_4_ = pBackendsToIterate._4_4_ + ma_backend_dsound) {
        (&local_88)[pBackendsToIterate._4_4_] = pBackendsToIterate._4_4_;
      }
      allocationCallbacks.onFree._4_4_ = backendCount;
      pmStack_98 = backends;
      if (backends == (ma_backend *)0x0) {
        pmStack_98 = &local_88;
        allocationCallbacks.onFree._4_4_ = 0xf;
      }
      pContext._4_4_ = -0x67;
      for (pBackendsToIterate._4_4_ = 0; pBackendsToIterate._4_4_ < allocationCallbacks.onFree._4_4_
          ; pBackendsToIterate._4_4_ = pBackendsToIterate._4_4_ + 1) {
        pContext._4_4_ =
             ma_context_init(pmStack_98 + pBackendsToIterate._4_4_,1,pContextConfig,
                             stack0xffffffffffffffb8);
        if (pContext._4_4_ == 0) {
          pContext._4_4_ = ma_device_init(stack0xffffffffffffffb8,pConfig,pDevice);
          if (pContext._4_4_ == 0) break;
          ma_context_uninit(stack0xffffffffffffffb8);
        }
      }
      if (pContext._4_4_ == 0) {
        pDevice->isOwnerOfContext = '\x01';
        backends_local._4_4_ = pContext._4_4_;
      }
      else {
        ma__free_from_callbacks(stack0xffffffffffffffb8,(ma_allocation_callbacks *)local_c0);
        backends_local._4_4_ = pContext._4_4_;
      }
    }
  }
  return backends_local._4_4_;
}

Assistant:

MA_API ma_result ma_device_init_ex(const ma_backend backends[], ma_uint32 backendCount, const ma_context_config* pContextConfig, const ma_device_config* pConfig, ma_device* pDevice)
{
    ma_result result;
    ma_context* pContext;
    ma_backend defaultBackends[ma_backend_null+1];
    ma_uint32 iBackend;
    ma_backend* pBackendsToIterate;
    ma_uint32 backendsToIterateCount;
    ma_allocation_callbacks allocationCallbacks;

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pContextConfig != NULL) {
        result = ma_allocation_callbacks_init_copy(&allocationCallbacks, &pContextConfig->allocationCallbacks);
        if (result != MA_SUCCESS) {
            return result;
        }
    } else {
        allocationCallbacks = ma_allocation_callbacks_init_default();
    }


    pContext = (ma_context*)ma__malloc_from_callbacks(sizeof(*pContext), &allocationCallbacks);
    if (pContext == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    for (iBackend = 0; iBackend <= ma_backend_null; ++iBackend) {
        defaultBackends[iBackend] = (ma_backend)iBackend;
    }

    pBackendsToIterate = (ma_backend*)backends;
    backendsToIterateCount = backendCount;
    if (pBackendsToIterate == NULL) {
        pBackendsToIterate = (ma_backend*)defaultBackends;
        backendsToIterateCount = ma_countof(defaultBackends);
    }

    result = MA_NO_BACKEND;

    for (iBackend = 0; iBackend < backendsToIterateCount; ++iBackend) {
        result = ma_context_init(&pBackendsToIterate[iBackend], 1, pContextConfig, pContext);
        if (result == MA_SUCCESS) {
            result = ma_device_init(pContext, pConfig, pDevice);
            if (result == MA_SUCCESS) {
                break;  /* Success. */
            } else {
                ma_context_uninit(pContext);   /* Failure. */
            }
        }
    }

    if (result != MA_SUCCESS) {
        ma__free_from_callbacks(pContext, &allocationCallbacks);
        return result;
    }

    pDevice->isOwnerOfContext = MA_TRUE;
    return result;
}